

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sun.cpp
# Opt level: O2

ON__UINT32 __thiscall ON_Sun::DataCRC(ON_Sun *this,ON__UINT32 crc)

{
  bool bVar1;
  ON__UINT32 OVar2;
  int x;
  ON__INT64 OVar3;
  double dVar4;
  int d;
  int m;
  int y;
  double h;
  int local_44;
  int local_40;
  int local_3c;
  double local_38;
  
  bVar1 = EnableAllowed(this);
  OVar2 = UpdateCRC<bool>(crc,bVar1);
  bVar1 = EnableOn(this);
  OVar2 = UpdateCRC<bool>(OVar2,bVar1);
  bVar1 = ManualControlAllowed(this);
  OVar2 = UpdateCRC<bool>(OVar2,bVar1);
  bVar1 = ManualControlOn(this);
  OVar2 = UpdateCRC<bool>(OVar2,bVar1);
  bVar1 = DaylightSavingOn(this);
  OVar2 = UpdateCRC<bool>(OVar2,bVar1);
  x = DaylightSavingMinutes(this);
  OVar2 = UpdateCRC<int>(OVar2,x);
  dVar4 = Azimuth(this);
  OVar3 = Integerize(dVar4);
  OVar2 = UpdateCRC<long>(OVar2,OVar3);
  dVar4 = Altitude(this);
  OVar3 = Integerize(dVar4);
  OVar2 = UpdateCRC<long>(OVar2,OVar3);
  dVar4 = North(this);
  OVar3 = Integerize(dVar4);
  OVar2 = UpdateCRC<long>(OVar2,OVar3);
  dVar4 = Latitude(this);
  OVar3 = Integerize(dVar4);
  OVar2 = UpdateCRC<long>(OVar2,OVar3);
  dVar4 = Longitude(this);
  OVar3 = Integerize(dVar4);
  OVar2 = UpdateCRC<long>(OVar2,OVar3);
  dVar4 = TimeZone(this);
  OVar3 = Integerize(dVar4);
  OVar2 = UpdateCRC<long>(OVar2,OVar3);
  dVar4 = ShadowIntensity(this);
  OVar3 = Integerize(dVar4);
  OVar2 = UpdateCRC<long>(OVar2,OVar3);
  dVar4 = Intensity(this);
  OVar3 = Integerize(dVar4);
  OVar2 = UpdateCRC<long>(OVar2,OVar3);
  local_3c = 0;
  local_40 = 0;
  local_44 = 0;
  local_38 = 0.0;
  LocalDateTime(this,&local_3c,&local_40,&local_44,&local_38);
  OVar2 = UpdateCRC<int>(OVar2,local_3c);
  OVar2 = UpdateCRC<int>(OVar2,local_40);
  OVar2 = UpdateCRC<int>(OVar2,local_44);
  OVar3 = Integerize(local_38);
  OVar2 = UpdateCRC<long>(OVar2,OVar3);
  return OVar2;
}

Assistant:

ON__UINT32 ON_Sun::DataCRC(ON__UINT32 crc) const
{
  // We need to calculate the CRC of the underlying storage, so we can't allow virtual overrides to
  // execute because they might hide the real values we want to use.

  crc = UpdateCRC(crc, ON_Sun::EnableAllowed());
  crc = UpdateCRC(crc, ON_Sun::EnableOn());
  crc = UpdateCRC(crc, ON_Sun::ManualControlAllowed());
  crc = UpdateCRC(crc, ON_Sun::ManualControlOn());
  crc = UpdateCRC(crc, ON_Sun::DaylightSavingOn());
  crc = UpdateCRC(crc, ON_Sun::DaylightSavingMinutes());
  crc = UpdateCRC(crc, Integerize(ON_Sun::Azimuth()));
  crc = UpdateCRC(crc, Integerize(ON_Sun::Altitude()));
  crc = UpdateCRC(crc, Integerize(ON_Sun::North()));
  crc = UpdateCRC(crc, Integerize(ON_Sun::Latitude()));
  crc = UpdateCRC(crc, Integerize(ON_Sun::Longitude()));
  crc = UpdateCRC(crc, Integerize(ON_Sun::TimeZone()));
  crc = UpdateCRC(crc, Integerize(ON_Sun::ShadowIntensity()));
  crc = UpdateCRC(crc, Integerize(ON_Sun::Intensity()));

  int y = 0, m = 0, d = 0; double h = 0.0;
  ON_Sun::LocalDateTime(y, m, d, h);
  crc = UpdateCRC(crc, y);
  crc = UpdateCRC(crc, m);
  crc = UpdateCRC(crc, d);
  crc = UpdateCRC(crc, Integerize(h));

  return crc;
}